

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Track * __thiscall mkvparser::Tracks::GetTrackByNumber(Tracks *this,long tn)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  long in_RSI;
  long in_RDI;
  Track *pTrack;
  Track **j;
  Track **i;
  undefined8 *local_20;
  Track *local_8;
  
  if (in_RSI < 0) {
    local_8 = (Track *)0x0;
  }
  else {
    puVar1 = *(undefined8 **)(in_RDI + 0x30);
    local_20 = *(undefined8 **)(in_RDI + 0x28);
    do {
      if (local_20 == puVar1) {
        return (Track *)0x0;
      }
      puVar3 = local_20 + 1;
      local_8 = (Track *)*local_20;
      local_20 = puVar3;
    } while ((local_8 == (Track *)0x0) || (lVar2 = Track::GetNumber(local_8), in_RSI != lVar2));
  }
  return local_8;
}

Assistant:

const Track* Tracks::GetTrackByNumber(long tn) const {
  if (tn < 0)
    return NULL;

  Track** i = m_trackEntries;
  Track** const j = m_trackEntriesEnd;

  while (i != j) {
    Track* const pTrack = *i++;

    if (pTrack == NULL)
      continue;

    if (tn == pTrack->GetNumber())
      return pTrack;
  }

  return NULL;  // not found
}